

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O3

int contextSend(mpt_reply_context_defer *ctx,mpt_reply_data *rd,mpt_message *msg)

{
  uint8_t *ptr;
  int iVar1;
  int type;
  uint64_t id;
  char *pcVar2;
  uint64_t local_28;
  
  local_28 = 0;
  if ((ulong)rd->len == 0) {
    mpt_log((mpt_logger *)0x0,"contextSend",4,"%s: %s","bad reply operation","reply already sent");
    iVar1 = -1;
  }
  else if ((ctx->reply).send == (_func_int_void_ptr_mpt_reply_data_ptr_mpt_message_ptr *)0x0) {
    rd->len = 0;
    iVar1 = 0;
  }
  else {
    ptr = rd->val;
    mpt_message_buf2id(ptr,(ulong)rd->len,&local_28);
    if ((ctx->reply).ptr == (void *)0x0) {
      pcVar2 = "no reply target available";
      iVar1 = 0;
      type = 4;
    }
    else {
      rd->val[0] = rd->val[0] | 0x80;
      iVar1 = (*(ctx->reply).send)((ctx->reply).ptr,rd,msg);
      if (-1 < iVar1) {
        rd->len = 0;
        return iVar1;
      }
      *ptr = *ptr & 0x7f;
      pcVar2 = "reply send failed";
      type = 3;
    }
    mpt_log((mpt_logger *)0x0,"contextSend",type,"%s %s","unable to reply",local_28,pcVar2);
  }
  return iVar1;
}

Assistant:

static int contextSend(const MPT_STRUCT(reply_context_defer) *ctx, MPT_STRUCT(reply_data) *rd, const MPT_STRUCT(message) *msg)
{
	int ret;
	uint64_t id = 0;
	
	if (!rd->len) {
		mpt_log(0, __func__, MPT_LOG(Warning), "%s: %s",
		        MPT_tr("bad reply operation"), MPT_tr("reply already sent"));
		return MPT_ERROR(BadArgument);
	}
	if (!ctx->reply.send) {
		rd->len = 0;
		return 0;
	}
	mpt_message_buf2id(rd->val, rd->len, &id);
	
	if (!ctx->reply.ptr) {
		mpt_log(0, __func__, MPT_LOG(Warning), "%s %s",
		        MPT_tr("unable to reply"), id, MPT_tr("no reply target available"));
		return 0;
	}
	rd->val[0] |= 0x80;
	ret = ctx->reply.send(ctx->reply.ptr, rd, msg);
	if (ret >= 0) {
		rd->len = 0;
	} else {
		rd->val[0] &= 0x7f;
		mpt_log(0, __func__, MPT_LOG(Error), "%s %s",
		        MPT_tr("unable to reply"), id, MPT_tr("reply send failed"));
	}
	return ret;
}